

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::PErrorWriter::~PErrorWriter(PErrorWriter *this)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__PErrorWriter_001362e8;
  if ((this->super_Writer).m_proceed == true) {
    poVar1 = std::operator<<((ostream *)&((this->super_Writer).m_logger)->field_0x50,": ");
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::operator<<(poVar1," [");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,*piVar2);
    std::operator<<(poVar1,"]");
  }
  Writer::~Writer(&this->super_Writer);
  return;
}

Assistant:

PErrorWriter::~PErrorWriter(void) {
  if (m_proceed) {
#if ELPP_COMPILER_MSVC
    char buff[256];
    strerror_s(buff, 256, errno);
    m_logger->stream() << ": " << buff << " [" << errno << "]";
#else
    m_logger->stream() << ": " << strerror(errno) << " [" << errno << "]";
#endif
  }
}